

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

int strlen_html(SXML_CHAR *str)

{
  char cVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  _html_special_dict *p_Var6;
  long lVar7;
  bool bVar8;
  
  iVar3 = 0;
  if ((str != (SXML_CHAR *)0x0) && (cVar5 = *str, iVar3 = 0, cVar5 != '\0')) {
    lVar4 = 0;
    iVar3 = 0;
    do {
      if (cVar5 == '<') {
        bVar8 = false;
        p_Var6 = HTML_SPECIAL_DICT;
      }
      else {
        lVar2 = 0;
        do {
          lVar7 = lVar2;
          cVar1 = (&HTML_SPECIAL_DICT[1].chr)[lVar7];
          if (lVar7 + 0x18 == 0x78) {
            bVar8 = cVar1 == '\0';
            goto LAB_00106353;
          }
          lVar2 = lVar7 + 0x18;
        } while (cVar5 != cVar1);
        bVar8 = cVar1 == '\0';
        p_Var6 = (_html_special_dict *)(lVar7 + 0x10ad38);
      }
      iVar3 = iVar3 + p_Var6->html_len;
LAB_00106353:
      iVar3 = iVar3 + (uint)bVar8;
      cVar5 = str[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while (cVar5 != '\0');
  }
  return iVar3;
}

Assistant:

int strlen_html(SXML_CHAR* str)
{
	int i, j, n;
	
	if (str == NULL)
		return 0;

	n = 0;
	for (i = 0; str[i] != NULC; i++) {
		for (j = 0; HTML_SPECIAL_DICT[j].chr; j++) {
			if (str[i] == HTML_SPECIAL_DICT[j].chr) {
				n += HTML_SPECIAL_DICT[j].html_len;
				break;
			}
		}
		if (HTML_SPECIAL_DICT[j].chr == NULC)
			n++;
	}

	return n;
}